

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O0

int32_t u8Index(UTrie2 *trie,UChar32 c,int32_t i)

{
  uint uVar1;
  int iVar2;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int32_t idx;
  int32_t i_local;
  UChar32 c_local;
  UTrie2 *trie_local;
  
  uVar1 = c >> 5;
  if ((uint)c < 0xd800) {
    local_20 = (uint)trie->index[(int)uVar1] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar2 = 0;
      if (c < 0xdc00) {
        iVar2 = 0x140;
      }
      local_24 = (uint)trie->index[(int)(iVar2 + uVar1)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < trie->highStart) {
          local_30 = (uint)trie->index
                           [(int)((uint)trie->index[(c >> 0xb) + 0x820] + (uVar1 & 0x3f))] * 4 +
                     (c & 0x1fU);
        }
        else {
          local_30 = trie->highValueIndex;
        }
        local_2c = local_30;
      }
      else {
        if (trie->data32 == (uint32_t *)0x0) {
          local_28 = trie->indexLength;
        }
        else {
          local_28 = 0;
        }
        local_2c = local_28 + 0x80;
      }
      local_24 = local_2c;
    }
    local_20 = local_24;
  }
  return local_20 << 3 | i;
}

Assistant:

static inline int32_t
u8Index(const UTrie2 *trie, UChar32 c, int32_t i) {
    int32_t idx=
        _UTRIE2_INDEX_FROM_CP(
            trie,
            trie->data32==NULL ? trie->indexLength : 0,
            c);
    return (idx<<3)|i;
}